

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

ExprPtr __thiscall mathiu::impl::operator<(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  bool bVar1;
  Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>
  *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  RetType_conflict RVar3;
  ExprPtr EVar4;
  PatternHelper<matchit::impl::Wildcard> local_89;
  anon_class_16_2_441c8d4f local_88;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:575:27)>
  local_78;
  Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>_>
  local_5c;
  PatternHelper<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>_>_>
  local_5a;
  anon_class_16_2_441c8d4f local_58;
  PatternPair<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:573:48)>
  local_48;
  PatternPair<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:573:48)>
  local_30;
  ExprPtr *rhs_local;
  ExprPtr *lhs_local;
  
  local_30.mHandler.rhs = rhs;
  rhs_local = lhs;
  lhs_local = (ExprPtr *)this;
  bVar1 = equal(lhs,rhs);
  if (bVar1) {
    std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr
              ((shared_ptr<const_mathiu::impl::Expr> *)this,
               (shared_ptr<const_mathiu::impl::Expr> *)false_);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    matchit::impl::
    match<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>
              ((impl *)&local_30,rhs_local,local_30.mHandler.rhs);
    local_58.lhs = rhs_local;
    local_58.rhs = local_30.mHandler.rhs;
    matchit::impl::
    ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>>
              (&local_5c,(impl *)&asDouble,
               (Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>
                *)&asDouble,in_RCX);
    matchit::impl::PatternPipable::operator|
              (&local_5a,(PatternPipable *)&matchit::impl::pattern,&local_5c);
    matchit::impl::
    PatternHelper<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::{lambda(auto:1&&)#1}>,matchit::impl::Meet<mathiu::impl::asDouble::{lambda(auto:1&&)#1}>>>
    ::operator<(&local_48,
                (PatternHelper<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>>>
                 *)&local_5a,&local_58);
    local_88.lhs = rhs_local;
    local_88.rhs = local_30.mHandler.rhs;
    matchit::impl::PatternPipable::operator|
              ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
    matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator<(&local_78,&local_89,&local_88);
    RVar3 = matchit::impl::
            MatchHelper<std::tuple<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>,false>
            ::operator<((MatchHelper<std::tuple<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>,false>
                         *)this,&local_30,
                        (PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:575:27)>
                         *)&local_48);
    _Var2 = RVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator<(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return false_;
        }
        return match(lhs, rhs)(
            pattern | ds(asDouble, asDouble) = [&]
            { return evald(lhs) < evald(rhs) ? true_ : false_; },
            pattern | _ = [&]
            { return makeSharedExprPtr(Relational{RelationalKind::kLESS, lhs, rhs}); });
    }